

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void send_message(int id_destination,int id_message)

{
  void *__buf;
  int __fd;
  mapped_type *pmVar1;
  size_t __n;
  mapped_type *pmVar2;
  ssize_t sVar3;
  sockaddr_in addr;
  string local_50 [8];
  string str_addr;
  ssize_t size;
  void *local_20;
  pair<void_*,_int> send_buf;
  int id_message_local;
  int id_destination_local;
  
  send_buf.second = id_message;
  send_buf._12_4_ = id_destination;
  std::pair<int,_int>::pair<int_&,_int_&,_true>
            ((pair<int,_int> *)&size,(int *)&send_buf.field_0xc,&send_buf.second);
  pmVar1 = std::
           map<std::pair<int,_int>,_std::pair<void_*,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<void_*,_int>_>_>_>
           ::operator[](&MM,(key_type *)&size);
  __fd = socket_fd;
  __buf = pmVar1->first;
  send_buf.first = *(void **)&pmVar1->second;
  __n = (size_t)(int)send_buf.first;
  local_20 = __buf;
  pmVar2 = std::
           map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
           ::operator[](&connections,(key_type *)&send_buf.field_0xc);
  sVar3 = sendto(__fd,__buf,__n,0,(sockaddr *)pmVar2,0x10);
  if (sVar3 < 0) {
    perror("Send");
  }
  else {
    pmVar2 = std::
             map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
             ::operator[](&connections,(key_type *)&send_buf.field_0xc);
    addr.sin_zero = *(uchar (*) [8])pmVar2;
    addr._0_8_ = local_50;
    pack_address_abi_cxx11_(addr);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void send_message(int id_destination, int id_message) {
    std::pair<void*, int> send_buf = MM[{id_destination, id_message}];
    //fprintf(stderr, "Send message: %d %d\n", id_destination, id_message);
    //fprintf(stderr, "Type: %d\n", ntohl(((uint32_t*)send_buf.first)[0]));
    ssize_t size = sendto(socket_fd, send_buf.first, (size_t)send_buf.second, 0,
                          (struct sockaddr *)&connections[id_destination], sizeof(struct sockaddr_in));
    if (size < 0) {
        perror("Send");
        return;
    }
    std::string str_addr = pack_address(connections[id_destination]);
}